

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O0

string * searchFilenameInRpaths(string *rpath_file,string *dependent_file)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  int n_00;
  key_type *__k;
  reference pbVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ostream *poVar7;
  char *pcVar8;
  string *in_RSI;
  string *in_RDI;
  string search_path;
  int n;
  int searchPathAmount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rpath;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  anon_class_24_3_7b6e7f73 check_path;
  string suffix;
  char buffer [4096];
  string *fullpath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffedb8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffedc0;
  uint in_stack_ffffffffffffedc8;
  undefined7 in_stack_ffffffffffffede0;
  byte in_stack_ffffffffffffede7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffede8;
  undefined8 in_stack_ffffffffffffedf0;
  flag_type __f;
  key_type *in_stack_ffffffffffffedf8;
  undefined4 in_stack_ffffffffffffee00;
  undefined2 in_stack_ffffffffffffee04;
  undefined1 in_stack_ffffffffffffee06;
  undefined1 in_stack_ffffffffffffee07;
  char *in_stack_ffffffffffffee08;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffee10;
  string *__s;
  string local_11d0 [24];
  string *in_stack_ffffffffffffee48;
  string local_11b0 [32];
  string local_1190 [32];
  string local_1170 [32];
  string local_1150 [32];
  int local_1130;
  int local_112c;
  iterator in_stack_ffffffffffffeed8;
  _Self local_1120;
  int local_1114;
  string local_1110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10c8;
  key_type *local_10c0;
  string local_10b8 [32];
  _Self local_1098;
  _Self local_1090 [10];
  string local_1040 [39];
  byte local_1019;
  char local_1018 [3784];
  string *in_stack_fffffffffffffeb0;
  anon_class_24_3_7b6e7f73 *in_stack_fffffffffffffeb8;
  
  __f = (flag_type)((ulong)in_stack_ffffffffffffedf0 >> 0x20);
  local_1019 = 0;
  __s = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffee07,
                      CONCAT16(in_stack_ffffffffffffee06,
                               CONCAT24(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00))),
             (char *)in_stack_ffffffffffffedf8,__f);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (__s,in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,
             CONCAT13(in_stack_ffffffffffffee07,
                      CONCAT12(in_stack_ffffffffffffee06,in_stack_ffffffffffffee04)));
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (in_stack_ffffffffffffedc0);
  local_1090[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffedb8,(key_type *)0x10a965);
  local_1098._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffedb8);
  bVar1 = std::operator!=(local_1090,&local_1098);
  if (bVar1) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffee07,
                                      CONCAT16(in_stack_ffffffffffffee06,
                                               CONCAT24(in_stack_ffffffffffffee04,
                                                        in_stack_ffffffffffffee00))),
                          in_stack_ffffffffffffedf8);
    std::__cxx11::string::operator=((string *)__s,(string *)pmVar5);
  }
  else {
    std::__cxx11::string::string(local_10b8,in_RSI);
    uVar2 = searchFilenameInRpaths::anon_class_24_3_7b6e7f73::operator()
                      (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    bVar3 = uVar2 ^ 0xff;
    std::__cxx11::string::~string(local_10b8);
    if ((bVar3 & 1) != 0) {
      __k = (key_type *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)CONCAT17(uVar2,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffee04,
                                                                   in_stack_ffffffffffffee00))),
                         in_stack_ffffffffffffedf8);
      local_10c0 = __k;
      local_10c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffedb8);
      local_10d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffedb8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffedc0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffedb8), bVar1) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_10c8);
        std::__cxx11::string::string((string *)&local_10f0,(string *)pbVar4);
        in_stack_ffffffffffffede8 = &local_10f0;
        std::__cxx11::string::size();
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_ffffffffffffede8);
        if (*pcVar8 != '/') {
          std::__cxx11::string::operator+=((string *)&local_10f0,"/");
        }
        std::operator+(in_stack_ffffffffffffede8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffede7,in_stack_ffffffffffffede0));
        in_stack_ffffffffffffede7 =
             searchFilenameInRpaths::anon_class_24_3_7b6e7f73::operator()
                       (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        std::__cxx11::string::~string(local_1110);
        if ((in_stack_ffffffffffffede7 & 1) == 0) {
          local_1114 = 0;
        }
        else {
          local_1114 = 2;
        }
        std::__cxx11::string::~string((string *)&local_10f0);
        if (local_1114 != 0) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_10c8);
      }
      local_1120._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(in_stack_ffffffffffffedb8,(key_type *)0x10ac88);
      in_stack_ffffffffffffeed8 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_ffffffffffffedb8);
      bVar1 = std::operator!=(&local_1120,(_Self *)&stack0xffffffffffffeed8);
      if (bVar1) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT17(uVar2,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffee04,
                                                                        in_stack_ffffffffffffee00)))
                              ,__k);
        std::__cxx11::string::operator=((string *)__s,(string *)pmVar5);
      }
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    n_00 = Settings::searchPathAmount();
    local_112c = n_00;
    for (local_1130 = 0; local_1130 < local_112c; local_1130 = local_1130 + 1) {
      Settings::searchPath_abi_cxx11_(n_00);
      std::operator+(in_stack_ffffffffffffede8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffede7,in_stack_ffffffffffffede0));
      bVar1 = fileExists(in_stack_ffffffffffffee48);
      in_stack_ffffffffffffedc8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffedc8);
      std::__cxx11::string::~string(local_1170);
      if ((in_stack_ffffffffffffedc8 & 0x1000000) == 0) {
        local_1114 = 0;
      }
      else {
        std::operator+(in_stack_ffffffffffffede8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffede7,in_stack_ffffffffffffede0));
        std::__cxx11::string::operator=((string *)__s,local_1190);
        std::__cxx11::string::~string(local_1190);
        local_1114 = 4;
      }
      std::__cxx11::string::~string(local_1150);
      if (local_1114 != 0) break;
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING : can\'t get path for \'");
      poVar7 = std::operator<<((ostream *)__rhs,in_RSI);
      std::operator<<(poVar7,"\'\n");
      getUserInputDirForFile((string *)in_stack_ffffffffffffeed8._M_node);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(n_00,in_stack_ffffffffffffedc8),__rhs);
      std::__cxx11::string::operator=((string *)__s,local_11b0);
      std::__cxx11::string::~string(local_11b0);
      std::__cxx11::string::~string(local_11d0);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      pcVar8 = realpath(pcVar8,local_1018);
      if (pcVar8 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)__s,local_1018);
      }
    }
  }
  local_1019 = 1;
  local_1114 = 1;
  std::__cxx11::string::~string(local_1040);
  if ((local_1019 & 1) == 0) {
    std::__cxx11::string::~string((string *)__s);
  }
  return in_RDI;
}

Assistant:

std::string searchFilenameInRpaths(const std::string& rpath_file, const std::string& dependent_file)
{
    char buffer[PATH_MAX];
    std::string fullpath;
    std::string suffix = std::regex_replace(rpath_file, std::regex("^@[a-z_]+path/"), "");

    const auto check_path = [&](std::string path)
    {
        char buffer[PATH_MAX];
        std::string file_prefix = dependent_file.substr(0, dependent_file.rfind('/')+1);
        if (dependent_file != rpath_file)
        {
            std::string path_to_check;
            if (path.find("@loader_path") != std::string::npos)
            {
                path_to_check = std::regex_replace(path, std::regex("@loader_path/"), file_prefix);
            }
            else if (path.find("@rpath") != std::string::npos)
            {
                path_to_check = std::regex_replace(path, std::regex("@rpath/"), file_prefix);
            }
            if (realpath(path_to_check.c_str(), buffer))
            {
                fullpath = buffer;
                rpath_to_fullpath[rpath_file] = fullpath;
                return true;
            }
        }
        return false;
    };

    // fullpath previously stored
    if (rpath_to_fullpath.find(rpath_file) != rpath_to_fullpath.end())
    {
        fullpath = rpath_to_fullpath[rpath_file];
    }
    else if (!check_path(rpath_file))
    {
        for (auto rpath : rpaths_per_file[dependent_file])
        {
            if (rpath[rpath.size()-1] != '/') rpath += "/";
            if (check_path(rpath+suffix)) break;
        }
        if (rpath_to_fullpath.find(rpath_file) != rpath_to_fullpath.end())
        {
            fullpath = rpath_to_fullpath[rpath_file];
        }
    }

    if (fullpath.empty())
    {
        const int searchPathAmount = Settings::searchPathAmount();
        for (int n=0; n<searchPathAmount; n++)
        {
            std::string search_path = Settings::searchPath(n);
            if (fileExists(search_path+suffix))
            {
                fullpath = search_path + suffix;
                break;
            }
        }

        if (fullpath.empty())
        {
            std::cerr << "\n/!\\ WARNING : can't get path for '" << rpath_file << "'\n";
            fullpath = getUserInputDirForFile(suffix) + suffix;
            if (realpath(fullpath.c_str(), buffer))
            {
                fullpath = buffer;
            }
        }
    }

    return fullpath;
}